

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_states.cpp
# Opt level: O0

FState * __thiscall FStateDefinitions::FindState(FStateDefinitions *this,char *name)

{
  uint uVar1;
  FStateDefinitions *list;
  uint uVar2;
  FName *other;
  FState *local_60;
  FName local_40;
  uint local_3c;
  FStateDefinitions *pFStack_38;
  uint i;
  TArray<FStateDefine,_FStateDefine> *statelist;
  TArray<FName,_FName> *namelist;
  FStateDefine *statedef;
  char *name_local;
  FStateDefinitions *this_local;
  
  namelist = (TArray<FName,_FName> *)0x0;
  statedef = (FStateDefine *)name;
  name_local = (char *)this;
  statelist = (TArray<FStateDefine,_FStateDefine> *)MakeStateNameList(name);
  local_3c = 0;
  pFStack_38 = this;
  while( true ) {
    uVar1 = local_3c;
    uVar2 = TArray<FName,_FName>::Size((TArray<FName,_FName> *)statelist);
    list = pFStack_38;
    if (uVar2 <= uVar1) {
      if (namelist == (TArray<FName,_FName> *)0x0) {
        local_60 = (FState *)0x0;
      }
      else {
        local_60 = *(FState **)&namelist[1].Most;
      }
      return local_60;
    }
    other = TArray<FName,_FName>::operator[]((TArray<FName,_FName> *)statelist,(ulong)local_3c);
    FName::FName(&local_40,other);
    namelist = (TArray<FName,_FName> *)FindStateLabelInList(&list->StateLabels,&local_40,false);
    if ((FStateDefine *)namelist == (FStateDefine *)0x0) break;
    pFStack_38 = (FStateDefinitions *)&((FStateDefine *)namelist)->Children;
    local_3c = local_3c + 1;
  }
  return (FState *)0x0;
}

Assistant:

FState *FStateDefinitions::FindState(const char * name)
{
	FStateDefine *statedef = NULL;

	TArray<FName> &namelist = MakeStateNameList(name);

	TArray<FStateDefine> *statelist = &StateLabels;
	for(unsigned i = 0; i < namelist.Size(); i++)
	{
		statedef = FindStateLabelInList(*statelist, namelist[i], false);
		if (statedef == NULL)
		{
			return NULL;
		}
		statelist = &statedef->Children;
	}
	return statedef ? statedef->State : NULL;
}